

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcoli.c
# Opt level: O0

int ffi2fi4(short *input,long ntodo,double scale,double zero,int *output,int *status)

{
  double dVar1;
  double dvalue;
  long ii;
  int *status_local;
  int *output_local;
  double zero_local;
  double scale_local;
  long ntodo_local;
  short *input_local;
  
  if ((((scale != 1.0) || (NAN(scale))) || (zero != 0.0)) || (NAN(zero))) {
    for (ii = 0; ii < ntodo; ii = ii + 1) {
      dVar1 = ((double)(int)input[ii] - zero) / scale;
      if (-2147483648.49 <= dVar1) {
        if (dVar1 <= 2147483647.49) {
          if (dVar1 < 0.0) {
            output[ii] = (int)(dVar1 - 0.5);
          }
          else {
            output[ii] = (int)(dVar1 + 0.5);
          }
        }
        else {
          *status = -0xb;
          output[ii] = 0x7fffffff;
        }
      }
      else {
        *status = -0xb;
        output[ii] = -0x80000000;
      }
    }
  }
  else {
    for (ii = 0; ii < ntodo; ii = ii + 1) {
      output[ii] = (int)input[ii];
    }
  }
  return *status;
}

Assistant:

int ffi2fi4(short *input,      /* I - array of values to be converted  */
            long ntodo,        /* I - number of elements in the array  */
            double scale,      /* I - FITS TSCALn or BSCALE value      */
            double zero,       /* I - FITS TZEROn or BZERO  value      */
            INT32BIT *output,  /* O - output array of converted values */
            int *status)       /* IO - error status                    */
/*
  Copy input to output prior to writing output to a FITS file.
  Do datatype conversion and scaling if required
*/
{
    long ii;
    double dvalue;

    if (scale == 1. && zero == 0.)
    {       
        for (ii = 0; ii < ntodo; ii++)
            output[ii] = (INT32BIT) input[ii];   /* just copy input to output */
    }
    else
    {
        for (ii = 0; ii < ntodo; ii++)
        {
            dvalue = (input[ii] - zero) / scale;

            if (dvalue < DINT_MIN)
            {
                *status = OVERFLOW_ERR;
                output[ii] = INT32_MIN;
            }
            else if (dvalue > DINT_MAX)
            {
                *status = OVERFLOW_ERR;
                output[ii] = INT32_MAX;
            }
            else
            {
                if (dvalue >= 0)
                    output[ii] = (INT32BIT) (dvalue + .5);
                else
                    output[ii] = (INT32BIT) (dvalue - .5);
            }
        }
    }
    return(*status);
}